

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O1

void xhtmlNodeDumpOutput(xmlSaveCtxtPtr ctxt,xmlNodePtr cur)

{
  int iVar1;
  xmlOutputBufferPtr buf;
  long lVar2;
  xmlOutputBufferPtr out;
  _xmlDoc *p_Var3;
  bool bVar4;
  bool bVar5;
  xmlDocPtr pxVar6;
  xmlDocPtr pxVar7;
  _xmlDtd *p_Var8;
  int iVar9;
  xmlDocPtr cur_00;
  _xmlNode *p_Var10;
  xmlDocPtr pxVar11;
  _xmlDtd *p_Var12;
  _xmlDtd *p_Var13;
  char *pcVar14;
  _xmlNs *cur_01;
  _xmlDtd *p_Var15;
  xmlChar *httpequiv;
  _xmlDtd *local_78;
  _xmlDtd *local_68;
  xmlDocPtr local_60;
  _xmlDtd *local_50;
  _xmlDtd *local_48;
  xmlChar *local_40;
  xmlDocPtr local_38;
  
  if (cur == (xmlNodePtr)0x0) {
    return;
  }
  iVar1 = ctxt->format;
  buf = ctxt->buf;
  *(byte *)&ctxt->options = (byte)ctxt->options | 0x10;
  local_60 = (xmlDocPtr)0x0;
  pxVar7 = (xmlDocPtr)cur;
  cur_00 = (xmlDocPtr)cur->parent;
LAB_0016ee8b:
  pxVar11 = cur_00;
  cur_00 = pxVar7;
  if (cur_00->type == XML_DOCUMENT_FRAG_NODE) goto code_r0x0016ee99;
  switch(cur_00->type) {
  case XML_ELEMENT_NODE:
    if ((cur_00 != (xmlDocPtr)cur) && (ctxt->format == 1)) {
      xmlSaveWriteIndent(ctxt,0);
    }
    if (((xmlDocPtr)cur_00->parent != pxVar11) && (cur_00->children != (_xmlNode *)0x0)) {
      xhtmlNodeDumpOutput(ctxt,(xmlNodePtr)cur_00);
      break;
    }
    xmlOutputBufferWrite(buf,1,"<");
    if ((*(long *)&cur_00->compression != 0) &&
       (pcVar14 = *(char **)(*(long *)&cur_00->compression + 0x18), pcVar14 != (char *)0x0)) {
      xmlOutputBufferWriteString(buf,pcVar14);
      xmlOutputBufferWrite(buf,1,":");
    }
    xmlOutputBufferWriteString(buf,cur_00->name);
    for (cur_01 = cur_00->oldNs; cur_01 != (xmlNsPtr)0x0; cur_01 = cur_01->next) {
      xmlNsDumpOutput(ctxt->buf,cur_01,ctxt);
    }
    iVar9 = xmlStrEqual((xmlChar *)cur_00->name,"html");
    if (((iVar9 != 0) &&
        (lVar2._0_4_ = cur_00->compression, lVar2._4_4_ = cur_00->standalone, lVar2 == 0)) &&
       (cur_00->oldNs == (_xmlNs *)0x0)) {
      xmlOutputBufferWriteString(buf," xmlns=\"http://www.w3.org/1999/xhtml\"");
    }
    p_Var15 = cur_00->extSubset;
    if (p_Var15 != (_xmlDtd *)0x0) {
      out = ctxt->buf;
      p_Var3 = p_Var15->parent;
      local_78 = (_xmlDtd *)0x0;
      local_68 = (_xmlDtd *)0x0;
      local_48 = (_xmlDtd *)0x0;
      local_50 = (_xmlDtd *)0x0;
      do {
        p_Var13 = local_50;
        if ((((((p_Var15->notations != (void *)0x0) ||
               (iVar9 = xmlStrEqual(p_Var15->name,"id"), p_Var12 = p_Var15, p_Var8 = local_48,
               iVar9 == 0)) &&
              ((p_Var12 = local_68, p_Var15->notations != (void *)0x0 ||
               (iVar9 = xmlStrEqual(p_Var15->name,"name"), p_Var8 = p_Var15, iVar9 == 0)))) &&
             ((p_Var15->notations != (void *)0x0 ||
              (iVar9 = xmlStrEqual(p_Var15->name,"lang"), p_Var13 = p_Var15, p_Var8 = local_48,
              iVar9 == 0)))) &&
            (p_Var13 = local_50, p_Var8 = local_48, p_Var15->notations != (void *)0x0)) &&
           ((iVar9 = xmlStrEqual(p_Var15->name,"lang"), iVar9 != 0 &&
            (iVar9 = xmlStrEqual(*(xmlChar **)((long)p_Var15->notations + 0x18),(xmlChar *)"xml"),
            iVar9 != 0)))) {
          local_78 = p_Var15;
        }
        local_48 = p_Var8;
        local_50 = p_Var13;
        local_68 = p_Var12;
        xmlAttrDumpOutput(ctxt,(xmlAttrPtr)p_Var15);
        p_Var15 = (_xmlDtd *)p_Var15->next;
      } while (p_Var15 != (_xmlDtd *)0x0);
      if (((((local_48 != (_xmlDtd *)0x0) && (local_68 == (_xmlDtd *)0x0)) &&
           (p_Var3 != (_xmlDoc *)0x0)) && ((xmlChar *)p_Var3->name != (xmlChar *)0x0)) &&
         ((((iVar9 = xmlStrEqual((xmlChar *)p_Var3->name,"a"), iVar9 != 0 ||
            (iVar9 = xmlStrEqual((xmlChar *)p_Var3->name,"p"), iVar9 != 0)) ||
           ((iVar9 = xmlStrEqual((xmlChar *)p_Var3->name,"div"), iVar9 != 0 ||
            ((iVar9 = xmlStrEqual((xmlChar *)p_Var3->name,(xmlChar *)"img"), iVar9 != 0 ||
             (iVar9 = xmlStrEqual((xmlChar *)p_Var3->name,"map"), iVar9 != 0)))))) ||
          ((iVar9 = xmlStrEqual((xmlChar *)p_Var3->name,(xmlChar *)"applet"), iVar9 != 0 ||
           (((iVar9 = xmlStrEqual((xmlChar *)p_Var3->name,"form"), iVar9 != 0 ||
             (iVar9 = xmlStrEqual((xmlChar *)p_Var3->name,"frame"), iVar9 != 0)) ||
            (iVar9 = xmlStrEqual((xmlChar *)p_Var3->name,(xmlChar *)"iframe"), iVar9 != 0)))))))) {
        xmlOutputBufferWrite(out,5," id=\"");
        xmlSaveWriteAttrContent(ctxt,(xmlAttrPtr)local_48);
        xmlOutputBufferWrite(out,1,"\"");
      }
      if ((local_50 == (_xmlDtd *)0x0) || (local_78 != (_xmlDtd *)0x0)) {
        if ((local_78 == (_xmlDtd *)0x0) || (local_50 != (_xmlDtd *)0x0)) goto LAB_0016f5f1;
        iVar9 = 7;
        pcVar14 = " lang=\"";
        local_50 = local_78;
      }
      else {
        iVar9 = 0xb;
        pcVar14 = " xml:lang=\"";
      }
      xmlOutputBufferWrite(out,iVar9,pcVar14);
      xmlSaveWriteAttrContent(ctxt,(xmlAttrPtr)local_50);
      xmlOutputBufferWrite(out,1,"\"");
    }
LAB_0016f5f1:
    if (((pxVar11 == (xmlDocPtr)0x0) || ((_xmlDoc *)pxVar11->parent != cur_00->doc)) ||
       ((iVar9 = xmlStrEqual((xmlChar *)cur_00->name,"head"), iVar9 == 0 ||
        (iVar9 = xmlStrEqual((xmlChar *)pxVar11->name,"html"), iVar9 == 0)))) {
LAB_0016f608:
      bVar4 = true;
      bVar5 = false;
    }
    else {
      bVar5 = true;
      for (p_Var10 = cur_00->children; p_Var10 != (xmlNode *)0x0; p_Var10 = p_Var10->next) {
        iVar9 = xmlStrEqual(p_Var10->name,(xmlChar *)"meta");
        if (iVar9 != 0) {
          iVar9 = xmlNodeGetAttrValue(p_Var10,(xmlChar *)"http-equiv",(xmlChar *)0x0,&local_40);
          if (iVar9 < 0) {
            if (buf != (xmlOutputBufferPtr)0x0) {
              buf->error = 2;
            }
            xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,7,
                                (xmlError *)0x0);
          }
          else if (iVar9 == 0) {
            iVar9 = xmlStrcasecmp(local_40,(xmlChar *)"Content-Type");
            (*xmlFree)(local_40);
            if (iVar9 == 0) goto LAB_0016f608;
          }
        }
      }
      bVar4 = false;
    }
    if (cur_00->children == (_xmlNode *)0x0) {
      if (((*(long *)&cur_00->compression == 0) ||
          (*(long *)(*(long *)&cur_00->compression + 0x18) == 0)) &&
         (iVar9 = xhtmlIsEmpty((xmlNodePtr)cur_00), bVar4 && iVar9 == 1)) {
        iVar9 = 3;
        pcVar14 = " />";
      }
      else {
        xmlOutputBufferWrite(buf,1,">");
        if (bVar5) {
          if (ctxt->format == 1) {
            xmlOutputBufferWrite(buf,1,"\n");
            xmlSaveWriteIndent(ctxt,1);
          }
          xmlOutputBufferWriteString
                    (buf,"<meta http-equiv=\"Content-Type\" content=\"text/html; charset=");
          if (ctxt->encoding == (xmlChar *)0x0) {
            xmlOutputBufferWrite(buf,5,"UTF-8");
          }
          else {
            xmlOutputBufferWriteString(buf,(char *)ctxt->encoding);
          }
          xmlOutputBufferWrite(buf,4,"\" />");
          if (ctxt->format == 1) {
            xmlOutputBufferWrite(buf,1,"\n");
          }
        }
        xmlOutputBufferWrite(buf,2,"</");
        if ((*(long *)&cur_00->compression != 0) &&
           (pcVar14 = *(char **)(*(long *)&cur_00->compression + 0x18), pcVar14 != (char *)0x0)) {
          xmlOutputBufferWriteString(buf,pcVar14);
          xmlOutputBufferWrite(buf,1,":");
        }
        xmlOutputBufferWriteString(buf,cur_00->name);
        iVar9 = 1;
        pcVar14 = ">";
      }
      goto LAB_0016f0ba;
    }
    xmlOutputBufferWrite(buf,1,">");
    if (bVar5) {
      if (ctxt->format == 1) {
        xmlOutputBufferWrite(buf,1,"\n");
        xmlSaveWriteIndent(ctxt,1);
      }
      xmlOutputBufferWriteString
                (buf,"<meta http-equiv=\"Content-Type\" content=\"text/html; charset=");
      if (ctxt->encoding == (xmlChar *)0x0) {
        xmlOutputBufferWrite(buf,5,"UTF-8");
      }
      else {
        xmlOutputBufferWriteString(buf,(char *)ctxt->encoding);
      }
      xmlOutputBufferWrite(buf,4,"\" />");
    }
    if (ctxt->format == 1) {
      for (p_Var10 = cur_00->children; p_Var10 != (_xmlNode *)0x0; p_Var10 = p_Var10->next) {
        if ((p_Var10->type == XML_ENTITY_REF_NODE) || (p_Var10->type == XML_TEXT_NODE)) {
          ctxt->format = 0;
          local_60 = cur_00;
          break;
        }
      }
    }
    if (ctxt->format == 1) {
      xmlOutputBufferWrite(buf,1,"\n");
    }
    if (-1 < ctxt->level) {
      ctxt->level = ctxt->level + 1;
    }
    pxVar7 = (xmlDocPtr)cur_00->children;
    goto LAB_0016ee8b;
  case XML_ATTRIBUTE_NODE:
    xmlAttrDumpOutput(ctxt,(xmlAttrPtr)cur_00);
    break;
  case XML_TEXT_NODE:
    p_Var15 = cur_00->intSubset;
    if (p_Var15 != (_xmlDtd *)0x0) {
      if ((xmlChar *)cur_00->name == "textnoenc") {
        xmlOutputBufferWriteString(buf,(char *)p_Var15);
      }
      else if (ctxt->escape == (xmlCharEncodingOutputFunc)0x0) {
        xmlSerializeText(ctxt->buf,(xmlChar *)p_Var15,(uint)(ctxt->encoding == (xmlChar *)0x0) * 2);
      }
      else {
        xmlOutputBufferWriteEscape(buf,(xmlChar *)p_Var15,ctxt->escape);
      }
    }
    break;
  case XML_CDATA_SECTION_NODE:
    p_Var15 = cur_00->intSubset;
    if ((p_Var15 != (_xmlDtd *)0x0) &&
       (p_Var13 = p_Var15, local_38 = (xmlDocPtr)cur, *(char *)&p_Var15->_private != '\0')) {
      do {
        p_Var12 = p_Var13;
        if (*(char *)&p_Var15->_private == ']') {
          if ((*(char *)((long)&p_Var15->_private + 1) == ']') &&
             (*(char *)((long)&p_Var15->_private + 2) == '>')) {
            p_Var12 = (_xmlDtd *)((long)&p_Var15->_private + 2);
            xmlOutputBufferWrite(buf,9,"<![CDATA[");
            cur = (xmlNodePtr)local_38;
            xmlOutputBufferWrite(buf,(int)p_Var12 - (int)p_Var13,(char *)p_Var13);
            xmlOutputBufferWrite(buf,3,"]]>");
            p_Var15 = p_Var12;
          }
        }
        else if (*(char *)&p_Var15->_private == '\0') goto code_r0x0016efad;
        p_Var15 = (_xmlDtd *)((long)&p_Var15->_private + 1);
        p_Var13 = p_Var12;
      } while( true );
    }
    iVar9 = 0xc;
    pcVar14 = "<![CDATA[]]>";
    goto LAB_0016f0ba;
  case XML_ENTITY_REF_NODE:
    xmlOutputBufferWrite(buf,1,"&");
    xmlOutputBufferWriteString(buf,cur_00->name);
    iVar9 = 1;
    pcVar14 = ";";
    goto LAB_0016f0ba;
  case XML_PI_NODE:
    p_Var15 = cur_00->intSubset;
    xmlOutputBufferWrite(buf,2,"<?");
    xmlOutputBufferWriteString(buf,cur_00->name);
    if ((p_Var15 != (_xmlDtd *)0x0) && (cur_00->intSubset != (_xmlDtd *)0x0)) {
      xmlOutputBufferWrite(buf,1," ");
      xmlOutputBufferWriteString(buf,(char *)cur_00->intSubset);
    }
    iVar9 = 2;
    pcVar14 = "?>";
    goto LAB_0016f0ba;
  case XML_COMMENT_NODE:
    if (cur_00->intSubset != (_xmlDtd *)0x0) {
      xmlOutputBufferWrite(buf,4,"<!--");
      xmlOutputBufferWriteString(buf,(char *)cur_00->intSubset);
      iVar9 = 3;
      pcVar14 = "-->";
      goto LAB_0016f0ba;
    }
    break;
  case XML_DOCUMENT_NODE:
  case XML_HTML_DOCUMENT_NODE:
    xmlSaveDocInternal(ctxt,cur_00,ctxt->encoding);
    break;
  case XML_DTD_NODE:
    xmlDtdDumpOutput(ctxt,(xmlDtdPtr)cur_00);
    break;
  case XML_ELEMENT_DECL:
    xmlBufDumpElementDecl(buf,(xmlElementPtr)cur_00);
    break;
  case XML_ATTRIBUTE_DECL:
    xmlBufDumpAttributeDecl(buf,(xmlAttributePtr)cur_00);
    break;
  case XML_ENTITY_DECL:
    xmlBufDumpEntityDecl(buf,(xmlEntityPtr)cur_00);
    break;
  case XML_NAMESPACE_DECL:
    xmlNsDumpOutput(buf,(xmlNsPtr)cur_00,ctxt);
  }
switchD_0016eecd_caseD_6:
  pxVar6 = cur_00;
  while( true ) {
    cur_00 = pxVar11;
    if (pxVar6 == (xmlDocPtr)cur) {
      return;
    }
    if (ctxt->format == 1) {
      xmlOutputBufferWrite(buf,1,"\n");
    }
    pxVar7 = (xmlDocPtr)pxVar6->next;
    if ((xmlDocPtr)pxVar6->next != (xmlDocPtr)0x0) break;
    pxVar11 = (xmlDocPtr)cur_00->parent;
    pxVar6 = cur_00;
    if (cur_00->type == XML_ELEMENT_NODE) {
      if (0 < ctxt->level) {
        ctxt->level = ctxt->level + -1;
      }
      if (ctxt->format == 1) {
        xmlSaveWriteIndent(ctxt,0);
      }
      xmlOutputBufferWrite(buf,2,"</");
      if ((*(long *)&cur_00->compression != 0) &&
         (pcVar14 = *(char **)(*(long *)&cur_00->compression + 0x18), pcVar14 != (char *)0x0)) {
        xmlOutputBufferWriteString(buf,pcVar14);
        xmlOutputBufferWrite(buf,1,":");
      }
      xmlOutputBufferWriteString(buf,cur_00->name);
      xmlOutputBufferWrite(buf,1,">");
      if (cur_00 == local_60) {
        ctxt->format = iVar1;
        local_60 = (xmlDocPtr)0x0;
      }
    }
  }
  goto LAB_0016ee8b;
code_r0x0016ee99:
  if (((xmlDocPtr)cur_00->parent == pxVar11) &&
     (pxVar7 = (xmlDocPtr)cur_00->children, (xmlDocPtr)cur_00->children != (xmlDocPtr)0x0))
  goto LAB_0016ee8b;
  goto switchD_0016eecd_caseD_6;
code_r0x0016efad:
  if (p_Var13 != p_Var15) {
    xmlOutputBufferWrite(buf,9,"<![CDATA[");
    xmlOutputBufferWriteString(buf,(char *)p_Var13);
    iVar9 = 3;
    pcVar14 = "]]>";
LAB_0016f0ba:
    xmlOutputBufferWrite(buf,iVar9,pcVar14);
  }
  goto switchD_0016eecd_caseD_6;
}

Assistant:

static void
xhtmlNodeDumpOutput(xmlSaveCtxtPtr ctxt, xmlNodePtr cur) {
    int format = ctxt->format, addmeta, oldoptions;
    xmlNodePtr tmp, root, unformattedNode = NULL, parent;
    xmlChar *start, *end;
    xmlOutputBufferPtr buf = ctxt->buf;

    if (cur == NULL) return;

    oldoptions = ctxt->options;
    ctxt->options |= XML_SAVE_XHTML;

    root = cur;
    parent = cur->parent;
    while (1) {
        switch (cur->type) {
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
            xmlSaveDocInternal(ctxt, (xmlDocPtr) cur, ctxt->encoding);
	    break;

        case XML_NAMESPACE_DECL:
	    xmlNsDumpOutput(buf, (xmlNsPtr) cur, ctxt);
	    break;

        case XML_DTD_NODE:
            xmlDtdDumpOutput(ctxt, (xmlDtdPtr) cur);
	    break;

        case XML_DOCUMENT_FRAG_NODE:
            /* Always validate cur->parent when descending. */
            if ((cur->parent == parent) && (cur->children != NULL)) {
                parent = cur;
                cur = cur->children;
                continue;
            }
            break;

        case XML_ELEMENT_DECL:
            xmlBufDumpElementDecl(buf, (xmlElementPtr) cur);
	    break;

        case XML_ATTRIBUTE_DECL:
            xmlBufDumpAttributeDecl(buf, (xmlAttributePtr) cur);
	    break;

        case XML_ENTITY_DECL:
            xmlBufDumpEntityDecl(buf, (xmlEntityPtr) cur);
	    break;

        case XML_ELEMENT_NODE:
            addmeta = 0;

	    if ((cur != root) && (ctxt->format == 1))
                xmlSaveWriteIndent(ctxt, 0);

            /*
             * Some users like lxml are known to pass nodes with a corrupted
             * tree structure. Fall back to a recursive call to handle this
             * case.
             */
            if ((cur->parent != parent) && (cur->children != NULL)) {
                xhtmlNodeDumpOutput(ctxt, cur);
                break;
            }

            xmlOutputBufferWrite(buf, 1, "<");
            if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                xmlOutputBufferWriteString(buf, (const char *)cur->ns->prefix);
                xmlOutputBufferWrite(buf, 1, ":");
            }

            xmlOutputBufferWriteString(buf, (const char *)cur->name);
            if (cur->nsDef)
                xmlNsListDumpOutputCtxt(ctxt, cur->nsDef);
            if ((xmlStrEqual(cur->name, BAD_CAST "html") &&
                (cur->ns == NULL) && (cur->nsDef == NULL))) {
                /*
                 * 3.1.1. Strictly Conforming Documents A.3.1.1 3/
                 */
                xmlOutputBufferWriteString(buf,
                        " xmlns=\"http://www.w3.org/1999/xhtml\"");
            }
            if (cur->properties != NULL)
                xhtmlAttrListDumpOutput(ctxt, cur->properties);

            if ((parent != NULL) &&
                (parent->parent == (xmlNodePtr) cur->doc) &&
                xmlStrEqual(cur->name, BAD_CAST"head") &&
                xmlStrEqual(parent->name, BAD_CAST"html")) {

                tmp = cur->children;
                while (tmp != NULL) {
                    if (xmlStrEqual(tmp->name, BAD_CAST"meta")) {
                        int res;
                        xmlChar *httpequiv;

                        res = xmlNodeGetAttrValue(tmp, BAD_CAST "http-equiv",
                                                  NULL, &httpequiv);
                        if (res < 0) {
                            xmlSaveErrMemory(buf);
                        } else if (res == 0) {
                            if (xmlStrcasecmp(httpequiv,
                                        BAD_CAST"Content-Type") == 0) {
                                xmlFree(httpequiv);
                                break;
                            }
                            xmlFree(httpequiv);
                        }
                    }
                    tmp = tmp->next;
                }
                if (tmp == NULL)
                    addmeta = 1;
            }

            if (cur->children == NULL) {
                if (((cur->ns == NULL) || (cur->ns->prefix == NULL)) &&
                    ((xhtmlIsEmpty(cur) == 1) && (addmeta == 0))) {
                    /*
                     * C.2. Empty Elements
                     */
                    xmlOutputBufferWrite(buf, 3, " />");
                } else {
                    if (addmeta == 1) {
                        xmlOutputBufferWrite(buf, 1, ">");
                        if (ctxt->format == 1) {
                            xmlOutputBufferWrite(buf, 1, "\n");
                            xmlSaveWriteIndent(ctxt, 1);
                        }
                        xmlOutputBufferWriteString(buf,
                                "<meta http-equiv=\"Content-Type\" "
                                "content=\"text/html; charset=");
                        if (ctxt->encoding) {
                            xmlOutputBufferWriteString(buf,
                                    (const char *)ctxt->encoding);
                        } else {
                            xmlOutputBufferWrite(buf, 5, "UTF-8");
                        }
                        xmlOutputBufferWrite(buf, 4, "\" />");
                        if (ctxt->format == 1)
                            xmlOutputBufferWrite(buf, 1, "\n");
                    } else {
                        xmlOutputBufferWrite(buf, 1, ">");
                    }
                    /*
                     * C.3. Element Minimization and Empty Element Content
                     */
                    xmlOutputBufferWrite(buf, 2, "</");
                    if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                        xmlOutputBufferWriteString(buf,
                                (const char *)cur->ns->prefix);
                        xmlOutputBufferWrite(buf, 1, ":");
                    }
                    xmlOutputBufferWriteString(buf, (const char *)cur->name);
                    xmlOutputBufferWrite(buf, 1, ">");
                }
            } else {
                xmlOutputBufferWrite(buf, 1, ">");
                if (addmeta == 1) {
                    if (ctxt->format == 1) {
                        xmlOutputBufferWrite(buf, 1, "\n");
                        xmlSaveWriteIndent(ctxt, 1);
                    }
                    xmlOutputBufferWriteString(buf,
                            "<meta http-equiv=\"Content-Type\" "
                            "content=\"text/html; charset=");
                    if (ctxt->encoding) {
                        xmlOutputBufferWriteString(buf,
                                (const char *)ctxt->encoding);
                    } else {
                        xmlOutputBufferWrite(buf, 5, "UTF-8");
                    }
                    xmlOutputBufferWrite(buf, 4, "\" />");
                }

                if (ctxt->format == 1) {
                    tmp = cur->children;
                    while (tmp != NULL) {
                        if ((tmp->type == XML_TEXT_NODE) ||
                            (tmp->type == XML_ENTITY_REF_NODE)) {
                            unformattedNode = cur;
                            ctxt->format = 0;
                            break;
                        }
                        tmp = tmp->next;
                    }
                }

                if (ctxt->format == 1) xmlOutputBufferWrite(buf, 1, "\n");
                if (ctxt->level >= 0) ctxt->level++;
                parent = cur;
                cur = cur->children;
                continue;
            }

            break;

        case XML_TEXT_NODE:
	    if (cur->content == NULL)
                break;
	    if ((cur->name == xmlStringText) ||
		(cur->name != xmlStringTextNoenc)) {
                if (ctxt->escape)
                    xmlOutputBufferWriteEscape(buf, cur->content,
                                               ctxt->escape);
                else
                    xmlSaveWriteText(ctxt, cur->content, /* flags */ 0);
	    } else {
		/*
		 * Disable escaping, needed for XSLT
		 */
		xmlOutputBufferWriteString(buf, (const char *) cur->content);
	    }
	    break;

        case XML_PI_NODE:
            if (cur->content != NULL) {
                xmlOutputBufferWrite(buf, 2, "<?");
                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                if (cur->content != NULL) {
                    xmlOutputBufferWrite(buf, 1, " ");
                    xmlOutputBufferWriteString(buf,
                            (const char *)cur->content);
                }
                xmlOutputBufferWrite(buf, 2, "?>");
            } else {
                xmlOutputBufferWrite(buf, 2, "<?");
                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                xmlOutputBufferWrite(buf, 2, "?>");
            }
            break;

        case XML_COMMENT_NODE:
            if (cur->content != NULL) {
                xmlOutputBufferWrite(buf, 4, "<!--");
                xmlOutputBufferWriteString(buf, (const char *)cur->content);
                xmlOutputBufferWrite(buf, 3, "-->");
            }
            break;

        case XML_ENTITY_REF_NODE:
            xmlOutputBufferWrite(buf, 1, "&");
            xmlOutputBufferWriteString(buf, (const char *)cur->name);
            xmlOutputBufferWrite(buf, 1, ";");
            break;

        case XML_CDATA_SECTION_NODE:
            if (cur->content == NULL || *cur->content == '\0') {
                xmlOutputBufferWrite(buf, 12, "<![CDATA[]]>");
            } else {
                start = end = cur->content;
                while (*end != '\0') {
                    if (*end == ']' && *(end + 1) == ']' &&
                        *(end + 2) == '>') {
                        end = end + 2;
                        xmlOutputBufferWrite(buf, 9, "<![CDATA[");
                        xmlOutputBufferWrite(buf, end - start,
                                (const char *)start);
                        xmlOutputBufferWrite(buf, 3, "]]>");
                        start = end;
                    }
                    end++;
                }
                if (start != end) {
                    xmlOutputBufferWrite(buf, 9, "<![CDATA[");
                    xmlOutputBufferWriteString(buf, (const char *)start);
                    xmlOutputBufferWrite(buf, 3, "]]>");
                }
            }
            break;

        case XML_ATTRIBUTE_NODE:
            xmlAttrDumpOutput(ctxt, (xmlAttrPtr) cur);
	    break;

        default:
            break;
        }

        while (1) {
            if (cur == root)
                return;
            if (ctxt->format == 1)
                xmlOutputBufferWrite(buf, 1, "\n");
            if (cur->next != NULL) {
                cur = cur->next;
                break;
            }

            cur = parent;
            /* cur->parent was validated when descending. */
            parent = cur->parent;

            if (cur->type == XML_ELEMENT_NODE) {
                if (ctxt->level > 0) ctxt->level--;
                if (ctxt->format == 1)
                    xmlSaveWriteIndent(ctxt, 0);

                xmlOutputBufferWrite(buf, 2, "</");
                if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                    xmlOutputBufferWriteString(buf,
                            (const char *)cur->ns->prefix);
                    xmlOutputBufferWrite(buf, 1, ":");
                }

                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                xmlOutputBufferWrite(buf, 1, ">");

                if (cur == unformattedNode) {
                    ctxt->format = format;
                    unformattedNode = NULL;
                }
            }
        }
    }

    ctxt->options = oldoptions;
}